

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O2

char ** Dar_Permutations(int n)

{
  int nCols;
  char **pRes;
  ulong uVar1;
  ulong uVar2;
  char Array [50];
  
  nCols = Dar_Factorial(n);
  pRes = Dar_ArrayAlloc(nCols,n,1);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < n) {
    uVar2 = (ulong)(uint)n;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    Array[uVar1] = (char)uVar1;
  }
  Dar_Permutations_rec(pRes,nCols,n,Array);
  return pRes;
}

Assistant:

char ** Dar_Permutations( int n )
{
    char Array[50];
    char ** pRes;
    int nFact, i;
    // allocate memory
    nFact = Dar_Factorial( n );
    pRes  = Dar_ArrayAlloc( nFact, n, sizeof(char) );
    // fill in the permutations
    for ( i = 0; i < n; i++ )
        Array[i] = i;
    Dar_Permutations_rec( pRes, nFact, n, Array );
    // print the permutations
/*
    {
    int i, k;
    for ( i = 0; i < nFact; i++ )
    {
        printf( "{" );
        for ( k = 0; k < n; k++ )
            printf( " %d", pRes[i][k] );
        printf( " }\n" );
    }
    }
*/
    return pRes;
}